

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

void text_sequence_doit(t_text_sequence *x,int argc,t_atom *argv)

{
  t_float *ptVar1;
  t_atom *ptVar2;
  t_atomtype tVar3;
  undefined8 uVar4;
  t_pd *x_00;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  _binbuf *x_01;
  t_atom *ptVar8;
  t_atom *ptVar9;
  t_symbol *ptVar10;
  word wVar11;
  t_symbol *ptVar12;
  ulong uVar13;
  int iVar14;
  t_atom *ptVar15;
  long lVar16;
  size_t nbytes;
  _outlet *x_02;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  bool bVar20;
  t_float tVar21;
  t_float tVar22;
  t_float tVar23;
  t_float tVar24;
  t_atom tStack_68;
  ulong local_58;
  t_atom *local_50;
  ulong local_48;
  int local_40;
  uint local_3c;
  undefined4 local_38;
  bool local_31;
  
  ptVar15 = &tStack_68;
  local_50 = argv;
  local_40 = argc;
  x_01 = text_client_getbuf(&x->x_tc);
  if (x_01 == (_binbuf *)0x0) {
LAB_00186c21:
    x->x_onset = 0x7fffffff;
    x->x_loop = '\0';
    x->x_auto = '\0';
    outlet_bang(x->x_endout);
    return;
  }
  ptVar8 = binbuf_getvec(x_01);
  uVar6 = binbuf_getnatom(x_01);
  iVar18 = x->x_onset;
  if ((int)uVar6 <= iVar18) goto LAB_00186c21;
  uVar13 = (ulong)iVar18;
  lVar16 = (long)(int)uVar6;
  iVar14 = 1;
  if (x->x_lastto == (t_symbol *)0x0) {
    ptVar9 = ptVar8 + uVar13;
    if (ptVar8[uVar13].a_type == A_SYMBOL) {
      if ((ptVar9->a_w).w_symbol != x->x_waitsym) goto LAB_00186bf9;
      ptVar9 = ptVar8 + uVar13;
      for (; (long)uVar13 < lVar16; uVar13 = uVar13 + 1) {
        if ((ptVar9->a_type & ~A_FLOAT) == A_SEMI) goto LAB_0018702d;
        ptVar9 = ptVar9 + 1;
      }
      uVar13 = (ulong)uVar6;
LAB_0018702d:
      x->x_eaten = '\x01';
      iVar18 = iVar18 + 1;
      local_31 = true;
      local_38 = 0;
    }
    else {
      if (((ptVar8[uVar13].a_type != A_FLOAT) || (x->x_waitargc == 0)) ||
         (uVar17 = uVar13, x->x_eaten != '\0')) goto LAB_00186bf9;
      for (; (long)uVar17 < lVar16; uVar17 = uVar17 + 1) {
        if (((long)((long)x->x_waitargc + uVar13) <= (long)uVar17) || (ptVar9->a_type != A_FLOAT))
        goto LAB_0018705d;
        ptVar9 = ptVar9 + 1;
      }
      uVar17 = (ulong)uVar6;
LAB_0018705d:
      x->x_eaten = '\x01';
      iVar14 = 0;
      local_31 = true;
      local_38 = 0;
      uVar13 = uVar17 & 0xffffffff;
    }
  }
  else {
LAB_00186bf9:
    ptVar9 = ptVar8 + uVar13;
    for (; (long)uVar13 < lVar16; uVar13 = uVar13 + 1) {
      tVar3 = ptVar9->a_type;
      if ((tVar3 & ~A_FLOAT) == A_SEMI) {
        x->x_eaten = '\0';
        local_31 = tVar3 != A_COMMA;
        goto LAB_00186c63;
      }
      ptVar9 = ptVar9 + 1;
    }
    x->x_eaten = '\0';
    local_31 = true;
LAB_00186c63:
    local_38 = (int)CONCAT71((int7)(int3)(uVar6 >> 8),1);
  }
  uVar19 = (int)uVar13 - iVar18;
  iVar14 = iVar14 + (int)uVar13;
  iVar7 = 0x7fffffff;
  if (iVar14 < (int)uVar6) {
    iVar7 = iVar14;
  }
  x->x_onset = iVar7;
  local_3c = uVar19 + 1;
  local_58 = (ulong)local_3c;
  if ((int)uVar19 < 99) {
    ptVar15 = &tStack_68 + -(long)(int)local_3c;
    ptVar9 = ptVar15;
  }
  else {
    ptVar9 = (t_atom *)getbytes((ulong)local_3c << 4);
  }
  tStack_68.a_w.w_binbuf = (_binbuf *)(local_50 + -1);
  local_48 = (ulong)uVar19;
  uVar13 = 0;
  if (0 < (int)uVar19) {
    uVar13 = (ulong)uVar19;
  }
  for (lVar16 = 0; iVar14 = local_40, ptVar2 = local_50, uVar13 * 0x10 != lVar16;
      lVar16 = lVar16 + 0x10) {
    ptVar1 = (t_float *)((long)&ptVar8[iVar18].a_w + lVar16);
    tVar21 = ptVar1[-2];
    if ((int)tVar21 - A_FLOAT < 2) {
      tVar21 = ptVar1[-2];
      tVar22 = ptVar1[-1];
      tVar23 = *ptVar1;
      tVar24 = ptVar1[1];
LAB_00186cfe:
      ptVar1 = (t_float *)((long)&ptVar9->a_type + lVar16);
      *ptVar1 = tVar21;
      ptVar1[1] = tVar22;
      ptVar1[2] = tVar23;
      ptVar1[3] = tVar24;
    }
    else if (tVar21 == 1.26117e-44) {
      ptVar10 = *(t_symbol **)((long)&ptVar8[iVar18].a_w + lVar16);
      ptVar15[-1].a_w.w_symbol = (t_symbol *)0x186d5a;
      ptVar10 = binbuf_realizedollsym(ptVar10,iVar14,ptVar2,0);
      if (ptVar10 == (t_symbol *)0x0) {
        uVar4 = **(undefined8 **)((long)&ptVar8[iVar18].a_w + lVar16);
        ptVar15[-1].a_w.w_symbol = (t_symbol *)0x186da2;
        pd_error((void *)0x0,"$%s: not enough arguments supplied",uVar4);
        *(undefined4 *)((long)&ptVar9->a_type + lVar16) = 2;
        ptVar10 = &s_symbol;
      }
      else {
        *(undefined4 *)((long)&ptVar9->a_type + lVar16) = 2;
      }
      *(t_symbol **)((long)&ptVar9->a_w + lVar16) = ptVar10;
    }
    else if (tVar21 == 1.12104e-44) {
      uVar6 = *(uint *)((long)&ptVar8[iVar18].a_w + lVar16);
      if (0 < (int)uVar6 && (int)uVar6 <= local_40) {
        ptVar2 = (t_atom *)(tStack_68.a_w.w_binbuf + uVar6);
        tVar21 = (t_float)ptVar2->a_type;
        tVar22 = *(t_float *)&ptVar2->field_0x4;
        tVar23 = (ptVar2->a_w).w_float;
        tVar24 = *(t_float *)((long)&ptVar2->a_w + 4);
        goto LAB_00186cfe;
      }
      ptVar15[-1].a_w.w_symbol = (t_symbol *)0x186d37;
      pd_error(x,"argument $%d out of range");
      *(undefined4 *)((long)&ptVar9->a_type + lVar16) = 1;
      *(undefined4 *)((long)&ptVar9->a_w + lVar16) = 0;
    }
    else {
      ptVar15[-1].a_w.w_symbol = (t_symbol *)0x186d77;
      bug("text sequence");
    }
  }
  uVar6 = (uint)local_48;
  if ((char)local_38 == '\0') {
    x->x_loop = '\0';
    x->x_lastto = (t_symbol *)0x0;
    if (((uVar6 == 1) && (x->x_auto != '\0')) && (ptVar9->a_type == A_FLOAT)) {
      x->x_nextdelay = (ptVar9->a_w).w_float;
      return;
    }
    x_02 = x->x_waitout;
    if (x_02 == (_outlet *)0x0) {
      ptVar15[-1].a_w.w_symbol = (t_symbol *)0x186f4f;
      bug("text sequence 3");
      goto LAB_00186fc8;
    }
    x->x_auto = '\0';
    uVar19 = uVar6;
  }
  else {
    if (x->x_mainout == (_outlet *)0x0) {
      if (uVar6 == 0) {
        return;
      }
      ptVar10 = x->x_lastto;
      ptVar8 = ptVar9;
      uVar19 = uVar6;
      if (ptVar10 == (t_symbol *)0x0) {
        if (ptVar9->a_type == A_SYMBOL) {
          ptVar10 = (ptVar9->a_w).w_symbol;
          if (ptVar10 != (t_symbol *)0x0) {
            ptVar8 = ptVar9 + 1;
            uVar19 = uVar6 - 1;
            goto LAB_00186efe;
          }
          ptVar10 = (t_symbol *)0x0;
        }
        else {
          ptVar10 = (t_symbol *)0x0;
          ptVar15[-1].a_w.w_symbol = (t_symbol *)0x187058;
          bug("text sequence 2");
        }
      }
      else {
LAB_00186efe:
        x_00 = ptVar10->s_thing;
        if (x_00 != (t_pd *)0x0) {
          if (local_31 != false) {
            ptVar10 = (t_symbol *)0x0;
          }
          x->x_lastto = ptVar10;
          if (((int)uVar19 < 1) || (ptVar8->a_type != A_SYMBOL)) {
            ptVar15[-1].a_w.w_symbol = (t_symbol *)0x187013;
            pd_list(x_00,(t_symbol *)0x0,uVar19,ptVar8);
          }
          else {
            ptVar10 = (ptVar8->a_w).w_symbol;
            ptVar15[-1].a_w.w_symbol = (t_symbol *)0x186f3c;
            pd_typedmess(x_00,ptVar10,uVar19 - 1,ptVar8 + 1);
          }
          goto LAB_00186fc8;
        }
        pcVar5 = ptVar10->s_name;
        ptVar15[-1].a_w.w_symbol = (t_symbol *)0x187029;
        pd_error(x,"%s: no such object",pcVar5);
      }
      ptVar12 = (t_symbol *)0x0;
      if (local_31 == false) {
        ptVar12 = ptVar10;
      }
      x->x_lastto = ptVar12;
      goto LAB_00186fc8;
    }
    if (x->x_lastto == (t_symbol *)0x0) {
      bVar20 = true;
      local_3c = uVar6;
    }
    else {
      ptVar15[-1].a_w.w_symbol = (t_symbol *)0x186df6;
      memmove(ptVar9 + 1,ptVar9,(long)(int)uVar6 << 4);
      ptVar9->a_type = A_SYMBOL;
      ptVar10 = x->x_lastto;
      (ptVar9->a_w).w_symbol = ptVar10;
      bVar20 = ptVar10 == (t_symbol *)0x0;
    }
    if (local_31 == false) {
      if ((!(bool)(bVar20 ^ 1U | uVar6 == 0)) && (ptVar9->a_type == A_SYMBOL)) {
        wVar11 = ptVar9->a_w;
        goto LAB_00186f94;
      }
    }
    else {
      wVar11.w_symbol = (t_symbol *)0x0;
LAB_00186f94:
      x->x_lastto = (t_symbol *)wVar11;
    }
    x_02 = x->x_mainout;
    uVar19 = local_3c;
  }
  ptVar15[-1].a_w.w_symbol = (t_symbol *)0x186fc8;
  outlet_list(x_02,(t_symbol *)0x0,uVar19,ptVar9);
LAB_00186fc8:
  if (0x62 < (int)uVar6) {
    nbytes = local_58 << 4;
    ptVar15[-1].a_w.w_symbol = (t_symbol *)0x186fde;
    freebytes(ptVar9,nbytes);
  }
  return;
}

Assistant:

static void text_sequence_doit(t_text_sequence *x, int argc, t_atom *argv)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int n, i, onset, nfield, wait, eatsemi = 1, gotcomma = 0;
    t_atom *vec, *outvec, *ap;
    if (!b)
        goto nosequence;
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (x->x_onset >= n)
    {
    nosequence:
        x->x_onset = 0x7fffffff;
        x->x_loop = x->x_auto = 0;
        outlet_bang(x->x_endout);
        return;
    }
    onset = x->x_onset;

        /* test if leading numbers, or a leading symbol equal to our
        "wait symbol", are directing us to wait */
    if (!x->x_lastto && (
        (vec[onset].a_type == A_FLOAT && x->x_waitargc && !x->x_eaten) ||
            (vec[onset].a_type == A_SYMBOL &&
                vec[onset].a_w.w_symbol == x->x_waitsym)))
    {
        if (vec[onset].a_type == A_FLOAT)
        {
            for (i = onset; i < n && i < onset + x->x_waitargc &&
                vec[i].a_type == A_FLOAT; i++)
                    ;
            x->x_eaten = 1;
            eatsemi = 0;
        }
        else
        {
            for (i = onset; i < n && vec[i].a_type != A_SEMI &&
                vec[i].a_type != A_COMMA; i++)
                    ;
            x->x_eaten = 1;
            onset++;    /* symbol isn't part of wait list */
        }
        wait = 1;
    }
    else    /* message to send */
    {
        for (i = onset; i < n && vec[i].a_type != A_SEMI &&
            vec[i].a_type != A_COMMA; i++)
                ;
        wait = 0;
        x->x_eaten = 0;
        if (i < n && vec[i].a_type == A_COMMA)
            gotcomma = 1;
    }
    nfield = i - onset;
    i += eatsemi;
    if (i >= n)
        i = 0x7fffffff;
    x->x_onset = i;
        /* generate output list, realizing dolar sign atoms.  Allocate one
        extra atom in case we want to prepend a symbol later */
    ATOMS_ALLOCA(outvec, nfield+1);
    for (i = 0, ap = vec+onset; i < nfield; i++, ap++)
    {
        int type = ap->a_type;
        if (type == A_FLOAT || type == A_SYMBOL)
            outvec[i] = *ap;
        else if (type == A_DOLLAR)
        {
            int atno = ap->a_w.w_index-1;
            if (atno < 0 || atno >= argc)
            {
                pd_error(x, "argument $%d out of range", atno+1);
                SETFLOAT(outvec+i, 0);
            }
            else outvec[i] = argv[atno];
        }
        else if (type == A_DOLLSYM)
        {
            t_symbol *s =
                binbuf_realizedollsym(ap->a_w.w_symbol, argc, argv, 0);
            if (s)
                SETSYMBOL(outvec+i, s);
            else
            {
                pd_error(0, "$%s: not enough arguments supplied",
                    ap->a_w.w_symbol->s_name);
                SETSYMBOL(outvec+i, &s_symbol);
            }
        }
        else bug("text sequence");
    }
    if (wait)
    {
        x->x_loop = 0;
        x->x_lastto = 0;
        if (x->x_auto && nfield == 1 && outvec[0].a_type == A_FLOAT)
            x->x_nextdelay = outvec[0].a_w.w_float;
        else if (!x->x_waitout)
            bug("text sequence 3");
        else
        {
            x->x_auto = 0;
            outlet_list(x->x_waitout, 0, nfield, outvec);
        }
    }
    else if (x->x_mainout)
    {
        int n2 = nfield;
        if (x->x_lastto)
        {
            memmove(outvec+1, outvec, nfield * sizeof(*outvec));
            SETSYMBOL(outvec, x->x_lastto);
            n2++;
        }
        if (!gotcomma)
            x->x_lastto = 0;
        else if (!x->x_lastto && nfield && outvec->a_type == A_SYMBOL)
            x->x_lastto = outvec->a_w.w_symbol;
        outlet_list(x->x_mainout, 0, n2, outvec);
    }
    else if (nfield)
    {
        t_symbol *tosym = x->x_lastto;
        t_pd *to = 0;
        t_atom *vecleft = outvec;
        int nleft = nfield;
        if (!tosym)
        {
            if (outvec[0].a_type != A_SYMBOL)
                bug("text sequence 2");
            else tosym = outvec[0].a_w.w_symbol;
            vecleft++;
            nleft--;
        }
        if (tosym)
        {
            if (!(to = tosym->s_thing))
                pd_error(x, "%s: no such object", tosym->s_name);
        }
        x->x_lastto = (gotcomma ? tosym : 0);
        if (to)
        {
            if (nleft > 0 && vecleft[0].a_type == A_SYMBOL)
                typedmess(to, vecleft->a_w.w_symbol, nleft-1, vecleft+1);
            else pd_list(to, 0, nleft, vecleft);
        }
    }
    ATOMS_FREEA(outvec, nfield+1);
}